

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *tail_local;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list_local;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }